

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fontstash.h
# Opt level: O0

FONSglyph * fons__allocGlyph(FONSfont *font)

{
  FONSglyph *pFVar1;
  int local_1c;
  FONSfont *font_local;
  
  if (font->cglyphs < font->nglyphs + 1) {
    if (font->cglyphs == 0) {
      local_1c = 8;
    }
    else {
      local_1c = font->cglyphs << 1;
    }
    font->cglyphs = local_1c;
    pFVar1 = (FONSglyph *)realloc(font->glyphs,(long)font->cglyphs << 5);
    font->glyphs = pFVar1;
    if (font->glyphs == (FONSglyph *)0x0) {
      return (FONSglyph *)0x0;
    }
  }
  font->nglyphs = font->nglyphs + 1;
  return font->glyphs + (font->nglyphs + -1);
}

Assistant:

static FONSglyph* fons__allocGlyph(FONSfont* font)
{
	if (font->nglyphs+1 > font->cglyphs) {
		font->cglyphs = font->cglyphs == 0 ? 8 : font->cglyphs * 2;
		font->glyphs = (FONSglyph*)realloc(font->glyphs, sizeof(FONSglyph) * font->cglyphs);
		if (font->glyphs == NULL) return NULL;
	}
	font->nglyphs++;
	return &font->glyphs[font->nglyphs-1];
}